

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O1

void CVodeFree(void **cvode_mem)

{
  CVodeMem cv_mem;
  
  cv_mem = (CVodeMem)*cvode_mem;
  if (cv_mem != (CVodeMem)0x0) {
    cvFreeVectors(cv_mem);
    if (cv_mem->ownNLS != 0) {
      SUNNonlinSolFree(cv_mem->NLS);
      cv_mem->ownNLS = 0;
      cv_mem->NLS = (SUNNonlinearSolver)0x0;
    }
    CVodeQuadFree(cv_mem);
    CVodeSensFree(cv_mem);
    CVodeQuadSensFree(cv_mem);
    CVodeAdjFree(cv_mem);
    if (cv_mem->cv_lfree != (_func_int_CVodeMemRec_ptr *)0x0) {
      (*cv_mem->cv_lfree)(cv_mem);
    }
    if (0 < cv_mem->cv_nrtfn) {
      free(cv_mem->cv_glo);
      cv_mem->cv_glo = (sunrealtype *)0x0;
      free(cv_mem->cv_ghi);
      cv_mem->cv_ghi = (sunrealtype *)0x0;
      free(cv_mem->cv_grout);
      cv_mem->cv_grout = (sunrealtype *)0x0;
      free(cv_mem->cv_iroots);
      cv_mem->cv_iroots = (int *)0x0;
      free(cv_mem->cv_rootdir);
      cv_mem->cv_rootdir = (int *)0x0;
      free(cv_mem->cv_gactive);
      cv_mem->cv_gactive = (int *)0x0;
    }
    free(cv_mem->cv_cvals);
    cv_mem->cv_cvals = (sunrealtype *)0x0;
    free(cv_mem->cv_Xvecs);
    cv_mem->cv_Xvecs = (N_Vector *)0x0;
    free(cv_mem->cv_Zvecs);
    cv_mem->cv_Zvecs = (N_Vector *)0x0;
    if (cv_mem->proj_mem != (CVodeProjMem)0x0) {
      cvProjFree(&cv_mem->proj_mem);
    }
    free(*cvode_mem);
    *cvode_mem = (void *)0x0;
  }
  return;
}

Assistant:

void CVodeFree(void** cvode_mem)
{
  CVodeMem cv_mem;

  if (*cvode_mem == NULL) { return; }

  cv_mem = (CVodeMem)(*cvode_mem);

  cvFreeVectors(cv_mem);

  /* if CVODE created the nonlinear solver object then free it */
  if (cv_mem->ownNLS)
  {
    SUNNonlinSolFree(cv_mem->NLS);
    cv_mem->ownNLS = SUNFALSE;
    cv_mem->NLS    = NULL;
  }

  CVodeQuadFree(cv_mem);

  CVodeSensFree(cv_mem);

  CVodeQuadSensFree(cv_mem);

  CVodeAdjFree(cv_mem);

  if (cv_mem->cv_lfree != NULL) { cv_mem->cv_lfree(cv_mem); }

  if (cv_mem->cv_nrtfn > 0)
  {
    free(cv_mem->cv_glo);
    cv_mem->cv_glo = NULL;
    free(cv_mem->cv_ghi);
    cv_mem->cv_ghi = NULL;
    free(cv_mem->cv_grout);
    cv_mem->cv_grout = NULL;
    free(cv_mem->cv_iroots);
    cv_mem->cv_iroots = NULL;
    free(cv_mem->cv_rootdir);
    cv_mem->cv_rootdir = NULL;
    free(cv_mem->cv_gactive);
    cv_mem->cv_gactive = NULL;
  }

  free(cv_mem->cv_cvals);
  cv_mem->cv_cvals = NULL;
  free(cv_mem->cv_Xvecs);
  cv_mem->cv_Xvecs = NULL;
  free(cv_mem->cv_Zvecs);
  cv_mem->cv_Zvecs = NULL;

  if (cv_mem->proj_mem) { cvProjFree(&(cv_mem->proj_mem)); }

  free(*cvode_mem);
  *cvode_mem = NULL;
}